

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O1

int h264_residual_luma(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,
                      h264_macroblock *mb,int start,int end,int which)

{
  int32_t (*paiVar1) [16];
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int32_t (*block) [4] [64];
  int32_t (*paiVar10) [15];
  bool bVar11;
  int32_t tmp [16];
  
  lVar9 = (long)which;
  if ((start == 0) && (0xffffffe7 < mb->mb_type - 0x19)) {
    iVar7 = h264_residual_block(str,cabac,slice,mb,mb->block_luma_dc[lVar9],(int *)0x0,
                                h264_residual_luma::cattab[lVar9][0],0,0,0xf,0x10,1);
    if (iVar7 != 0) {
      return 1;
    }
  }
  else {
    mb->coded_block_flag[lVar9][0x10] = 0;
  }
  iVar7 = start + -1;
  if (start == 0) {
    iVar7 = 0;
  }
  bVar11 = mb->mb_type - 1 < 0x18;
  if (!bVar11) {
    iVar7 = start;
  }
  if ((cabac == (h264_cabac_context *)0x0) || (mb->transform_size_8x8_flag == 0)) {
    uVar3 = (uint)bVar11;
    uVar8 = 0;
    do {
      paiVar1 = mb->block_luma_4x4[lVar9] + uVar8;
      lVar2 = (uVar8 * 0x40 & 0xffffffffffffff00) + (ulong)((uint)uVar8 & 3) * 4;
      paiVar10 = mb->block_luma_ac[lVar9] + uVar8;
      if (mb->transform_size_8x8_flag == 0) {
        if (mb->mb_type - 0x19 < 0xffffffe8) {
          tmp._0_8_ = *(undefined8 *)*paiVar1;
          tmp._8_8_ = *(undefined8 *)(*paiVar1 + 2);
          tmp._16_8_ = *(undefined8 *)(*paiVar1 + 4);
          tmp._24_8_ = *(undefined8 *)(*paiVar1 + 6);
          tmp._32_8_ = *(undefined8 *)(*paiVar1 + 8);
          tmp[0xc] = (int32_t)*(undefined8 *)(*paiVar1 + 0xc);
          tmp[0xd] = (int32_t)((ulong)*(undefined8 *)(*paiVar1 + 0xc) >> 0x20);
          tmp[0xe] = (int32_t)*(undefined8 *)(*paiVar1 + 0xe);
          tmp[0xf] = (int32_t)((ulong)*(undefined8 *)(*paiVar1 + 0xe) >> 0x20);
          tmp[10] = (int32_t)*(undefined8 *)(*paiVar1 + 10);
          tmp[0xb] = (int32_t)((ulong)*(undefined8 *)(*paiVar1 + 10) >> 0x20);
          piVar6 = h264_residual_luma::cattab[lVar9] + 2;
        }
        else {
          tmp._0_8_ = *(undefined8 *)*paiVar10;
          tmp._8_8_ = *(undefined8 *)(*paiVar10 + 2);
          tmp._16_8_ = *(undefined8 *)(*paiVar10 + 4);
          tmp._24_8_ = *(undefined8 *)(*paiVar10 + 6);
          tmp._32_8_ = *(undefined8 *)(*paiVar10 + 8);
          tmp[0xc] = (int32_t)((ulong)*(undefined8 *)(*paiVar10 + 0xb) >> 0x20);
          tmp[0xd] = (int32_t)*(undefined8 *)(*paiVar10 + 0xd);
          tmp[0xe] = (int32_t)((ulong)*(undefined8 *)(*paiVar10 + 0xd) >> 0x20);
          tmp[10] = (int32_t)*(undefined8 *)(*paiVar10 + 10);
          tmp[0xb] = (int32_t)((ulong)*(undefined8 *)(*paiVar10 + 10) >> 0x20);
          piVar6 = h264_residual_luma::cattab[lVar9] + 1;
        }
      }
      else {
        lVar5 = 0;
        do {
          *(undefined4 *)((long)tmp + lVar5) =
               *(undefined4 *)((long)mb->block_luma_8x8[lVar9][0] + lVar5 * 4 + lVar2);
          lVar5 = lVar5 + 4;
          piVar6 = h264_residual_luma::cattab[lVar9] + 3;
        } while (lVar5 != 0x40);
      }
      iVar4 = h264_residual_block(str,cabac,slice,mb,tmp,mb->total_coeff[lVar9] + uVar8,*piVar6,
                                  (uint)uVar8,iVar7,end - uVar3,0x10 - uVar3,
                                  (uint)((mb->coded_block_pattern >> ((uint)(uVar8 >> 2) & 0x1f) & 1
                                         ) != 0));
      if (iVar4 != 0) {
        return 1;
      }
      if (mb->transform_size_8x8_flag == 0) {
        if (mb->mb_type - 0x19 < 0xffffffe8) {
          *(ulong *)(*paiVar1 + 0xc) = CONCAT44(tmp[0xd],tmp[0xc]);
          *(ulong *)(*paiVar1 + 0xe) = CONCAT44(tmp[0xf],tmp[0xe]);
          *(undefined8 *)(*paiVar1 + 8) = tmp._32_8_;
          *(ulong *)(*paiVar1 + 10) = CONCAT44(tmp[0xb],tmp[10]);
          *(undefined8 *)(*paiVar1 + 4) = tmp._16_8_;
          *(undefined8 *)(*paiVar1 + 6) = tmp._24_8_;
          *(undefined8 *)*paiVar1 = tmp._0_8_;
          *(undefined8 *)(*paiVar1 + 2) = tmp._8_8_;
        }
        else {
          *(ulong *)(*paiVar10 + 0xb) = CONCAT44(tmp[0xc],tmp[0xb]);
          *(ulong *)(*paiVar10 + 0xd) = CONCAT44(tmp[0xe],tmp[0xd]);
          *(undefined8 *)(*paiVar10 + 8) = tmp._32_8_;
          *(ulong *)(*paiVar10 + 10) = CONCAT44(tmp[0xb],tmp[10]);
          *(undefined8 *)(*paiVar10 + 4) = tmp._16_8_;
          *(undefined8 *)(*paiVar10 + 6) = tmp._24_8_;
          *(undefined8 *)*paiVar10 = tmp._0_8_;
          *(undefined8 *)(*paiVar10 + 2) = tmp._8_8_;
        }
      }
      else {
        lVar5 = 0;
        do {
          *(undefined4 *)((long)mb->block_luma_8x8[lVar9][0] + lVar5 * 4 + lVar2) =
               *(undefined4 *)((long)tmp + lVar5);
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0x40);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x10);
  }
  else {
    iVar7 = h264_residual_luma::cattab[lVar9][3];
    block = mb->block_luma_8x8 + lVar9;
    lVar9 = 0;
    do {
      iVar4 = h264_residual_cabac(str,cabac,slice,mb,(int32_t *)block,iVar7,(uint)lVar9,start << 2,
                                  end * 4 + 3,0x40,
                                  (uint)((mb->coded_block_pattern >> ((uint)lVar9 & 0x1f) & 1) != 0)
                                 );
      if (iVar4 != 0) {
        return 1;
      }
      lVar9 = lVar9 + 1;
      block = (int32_t (*) [4] [64])(*block + 1);
    } while (lVar9 != 4);
  }
  return 0;
}

Assistant:

int h264_residual_luma(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int start, int end, int which) {
	static const int cattab[3][4] = {
		{ H264_CTXBLOCKCAT_LUMA_DC, H264_CTXBLOCKCAT_LUMA_AC, H264_CTXBLOCKCAT_LUMA_4X4, H264_CTXBLOCKCAT_LUMA_8X8 }, 
		{ H264_CTXBLOCKCAT_CB_DC, H264_CTXBLOCKCAT_CB_AC, H264_CTXBLOCKCAT_CB_4X4, H264_CTXBLOCKCAT_CB_8X8 }, 
		{ H264_CTXBLOCKCAT_CR_DC, H264_CTXBLOCKCAT_CR_AC, H264_CTXBLOCKCAT_CR_4X4, H264_CTXBLOCKCAT_CR_8X8 }, 
	};
	if (start == 0 && h264_is_intra_16x16_mb_type(mb->mb_type)) {
		if (h264_residual_block(str, cabac, slice, mb, mb->block_luma_dc[which], 0, cattab[which][0], 0, 0, 15, 16, 1)) return 1;
	} else {
		mb->coded_block_flag[which][16] = 0;
	}
	int i, j;
	int n = (h264_is_intra_16x16_mb_type(mb->mb_type) ? 15 : 16);
	int ss = (h264_is_intra_16x16_mb_type(mb->mb_type) ? (start?start-1:0) : start);
	int se = (h264_is_intra_16x16_mb_type(mb->mb_type) ? end - 1 : end);
	if (!mb->transform_size_8x8_flag || !cabac) {
		for (i = 0; i < 16; i++) {
			int32_t tmp[16];
			int cat;
			if (mb->transform_size_8x8_flag) {
				for (j = 0; j < 16; j++)
					tmp[j] = mb->block_luma_8x8[which][i >> 2][4 * j + (i & 3)];
				cat = cattab[which][3];
			} else if (h264_is_intra_16x16_mb_type(mb->mb_type)) {
				for (j = 0; j < 15; j++)
					tmp[j] = mb->block_luma_ac[which][i][j];
				cat = cattab[which][1];
			} else {
				for (j = 0; j < 16; j++)
					tmp[j] = mb->block_luma_4x4[which][i][j];
				cat = cattab[which][2];
			}
			if (h264_residual_block(str, cabac, slice, mb, tmp, &mb->total_coeff[which][i], cat, i, ss, se, n, mb->coded_block_pattern >> (i >> 2) & 1)) return 1;
			if (mb->transform_size_8x8_flag) {
				for (j = 0; j < 16; j++)
					mb->block_luma_8x8[which][i >> 2][4 * j + (i & 3)] = tmp[j];
			} else if (h264_is_intra_16x16_mb_type(mb->mb_type)) {
				for (j = 0; j < 15; j++)
					mb->block_luma_ac[which][i][j] = tmp[j];
			} else {
				for (j = 0; j < 16; j++)
					mb->block_luma_4x4[which][i][j] = tmp[j];
			}
		}
	} else {
		for (i = 0; i < 4; i++) {
			if (h264_residual_block(str, cabac, slice, mb, mb->block_luma_8x8[which][i], 0, cattab[which][3], i, 4*start, 4*end + 3, 64, mb->coded_block_pattern >> i & 1)) return 1;
		}
	}
	return 0;
}